

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O3

Node * __thiscall
MarkerIndex::Iterator::insert_marker_start
          (Iterator *this,MarkerId *id,Point *start_position,Point *end_position)

{
  Point PVar1;
  int iVar2;
  Node *pNVar3;
  
  reset(this);
  if (this->current_node == (Node *)0x0) {
    pNVar3 = (Node *)operator_new(0x88);
    PVar1 = *start_position;
    pNVar3->parent = (Node *)0x0;
    pNVar3->left = (Node *)0x0;
    pNVar3->right = (Node *)0x0;
    pNVar3->left_extent = PVar1;
    (pNVar3->end_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pNVar3->end_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pNVar3->start_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pNVar3->end_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pNVar3->start_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pNVar3->start_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pNVar3->right_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (pNVar3->right_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pNVar3->left_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (pNVar3->right_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pNVar3->left_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (pNVar3->left_marker_ids).contents.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pNVar3->priority = 0;
    this->marker_index->root = pNVar3;
  }
  else {
    do {
      while( true ) {
        while (iVar2 = Point::compare(start_position,&this->current_node_position), iVar2 == -1) {
          mark_right(this,id,start_position,end_position);
          if (this->current_node->left == (Node *)0x0) {
            insert_left_child(this,start_position);
            descend_left(this);
            goto LAB_001611d4;
          }
          descend_left(this);
        }
        if (iVar2 != 1) break;
        if (this->current_node->right == (Node *)0x0) {
          insert_right_child(this,start_position);
          descend_right(this);
          goto LAB_001611d4;
        }
        descend_right(this);
      }
    } while (iVar2 != 0);
LAB_001611d4:
    mark_right(this,id,start_position,end_position);
    pNVar3 = this->current_node;
  }
  return pNVar3;
}

Assistant:

MarkerIndex::Node *MarkerIndex::Iterator::insert_marker_start(const MarkerId &id, const Point &start_position, const Point &end_position) {
  reset();

  if (!current_node) {
    return marker_index->root = new Node(nullptr, start_position);
  }

  while (true) {
    switch (start_position.compare(current_node_position)) {
      case 0:
        mark_right(id, start_position, end_position);
        return current_node;
      case -1:
        mark_right(id, start_position, end_position);
        if (current_node->left) {
          descend_left();
          break;
        } else {
          insert_left_child(start_position);
          descend_left();
          mark_right(id, start_position, end_position);
          return current_node;
        }
      case 1:
        if (current_node->right) {
          descend_right();
          break;
        } else {
          insert_right_child(start_position);
          descend_right();
          mark_right(id, start_position, end_position);
          return current_node;
        }
    }
  }
}